

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  int iVar1;
  size_t sVar2;
  char *in_RCX;
  char *pcStack_60;
  int size_diff;
  char *localized_endptr;
  char *localized_cstr;
  string localized;
  double result;
  char *temp_endptr;
  char **endptr_local;
  char *str_local;
  
  temp_endptr = (char *)endptr;
  endptr_local = (char **)str;
  localized.field_2._8_8_ = strtod(str,(char **)&result);
  if (temp_endptr != (char *)0x0) {
    *(double *)temp_endptr = result;
    in_RCX = (char *)result;
  }
  str_local = (char *)localized.field_2._8_8_;
  if (*(char *)result == '.') {
    (anonymous_namespace)::LocalizeRadix_abi_cxx11_
              ((string *)&localized_cstr,(_anonymous_namespace_ *)endptr_local,(char *)result,in_RCX
              );
    localized_endptr = (char *)std::__cxx11::string::c_str();
    localized.field_2._8_8_ = strtod(localized_endptr,&stack0xffffffffffffffa0);
    if (((long)result - (long)endptr_local < (long)pcStack_60 - (long)localized_endptr) &&
       (temp_endptr != (char *)0x0)) {
      iVar1 = std::__cxx11::string::size();
      sVar2 = strlen((char *)endptr_local);
      *(char **)temp_endptr =
           (char *)((long)endptr_local +
                   (long)(pcStack_60 + (-(long)(iVar1 - (int)sVar2) - (long)localized_endptr)));
    }
    str_local = (char *)localized.field_2._8_8_;
    std::__cxx11::string::~string((string *)&localized_cstr);
  }
  return (double)str_local;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}